

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QScriptItem>::clear(QList<QScriptItem> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QScriptItem> *this_00;
  __off_t __length;
  QArrayDataPointer<QScriptItem> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QScriptItem> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QScriptItem> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QScriptItem> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QScriptItem>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QScriptItem>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QScriptItem> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QScriptItem>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QScriptItem>::QArrayDataPointer(pQVar4,(qsizetype)alloc,(qsizetype)n,option)
      ;
      QArrayDataPointer<QScriptItem>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QScriptItem>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QScriptItem> *)QArrayDataPointer<QScriptItem>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QScriptItem>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }